

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void int_rel_reif(IntVar *x,IntRelType t,IntVar *y,BoolView *r,int c)

{
  IntRelType t_00;
  long lVar1;
  ulong uVar2;
  IntView<0> x_00;
  IntView<0> x_01;
  IntView<0> x_02;
  IntView<0> x_03;
  IntView<0> x_04;
  IntView<0> x_05;
  IntView<0> y_00;
  IntView<0> y_01;
  IntView<0> y_02;
  IntView<0> y_03;
  IntView<0> y_04;
  IntView<0> y_05;
  BoolView local_40;
  
  if (IRT_GT < t) {
    fprintf(_stderr,"%s:%d: ","binary.cpp",0x18e);
    fwrite("Assertion failed.\n",0x12,1,_stderr);
    abort();
  }
  uVar2 = (ulong)(uint)c;
  switch(t) {
  case IRT_EQ:
    lVar1 = (uVar2 << 0x20) + 1;
    x_00.a = 1;
    x_00.b = 0;
    x_00.var = x;
    y_00._8_8_ = lVar1;
    y_00.var = y;
    newBinGE(x_00,y_00,r);
    x_01.a = 1;
    x_01.b = 0;
    x_01.var = y;
    y_01._8_8_ = ((ulong)(uint)-c << 0x20) + 1;
    y_01.var = x;
    newBinGE(x_01,y_01,r);
    local_40.v = r->v;
    local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_40.s = (bool)(r->s ^ 1);
    x_02.a = 1;
    x_02.b = 0;
    x_02.var = x;
    y_02._8_8_ = lVar1;
    y_02.var = y;
    newBinNE(x_02,y_02,&local_40);
    return;
  case IRT_NE:
    local_40.v = r->v;
    local_40.s = r->s;
    t_00 = IRT_EQ;
    break;
  case IRT_LE:
    y_03._8_8_ = ((ulong)(uint)-c << 0x20) + 1;
    x_03.a = 1;
    x_03.b = 0;
    x_03.var = y;
    y_03.var = x;
    newBinGE(x_03,y_03,r);
    uVar2 = (ulong)(c + 1);
    goto LAB_0018f1e2;
  case IRT_LT:
    y_04._8_8_ = ((ulong)(1 - c) << 0x20) + 1;
    x_04.a = 1;
    x_04.b = 0;
    x_04.var = y;
    y_04.var = x;
    newBinGE(x_04,y_04,r);
LAB_0018f1e2:
    local_40.v = r->v;
    local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_40.s = (bool)(r->s ^ 1);
    x_05.a = 1;
    x_05.b = 0;
    x_05.var = x;
    y_05._8_8_ = (uVar2 << 0x20) + 1;
    y_05.var = y;
    newBinGE(x_05,y_05,&local_40);
    return;
  case IRT_GE:
    local_40.v = r->v;
    local_40.s = r->s;
    t_00 = IRT_LT;
    break;
  case IRT_GT:
    local_40.v = r->v;
    local_40.s = r->s;
    t_00 = IRT_LE;
  }
  local_40.s = (bool)(local_40.s ^ 1);
  local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
  int_rel_reif(x,t_00,y,&local_40,c);
  return;
}

Assistant:

void int_rel_reif(IntVar* x, IntRelType t, IntVar* y, const BoolView& r, int c) {
	switch (t) {
		case IRT_EQ:
			newBinGE(IntView<>(x), IntView<>(y, 1, c), r);
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			newBinNE(IntView<>(x), IntView<>(y, 1, c), ~r);
			break;
		case IRT_NE:
			int_rel_reif(x, IRT_EQ, y, ~r, c);
			break;
		case IRT_LE:
			// x <= y <-> r <=> y >= x <- r /\ x >= (y+1) <- !r
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			newBinGE(IntView<>(x), IntView<>(y, 1, 1 + c), ~r);
			break;
		case IRT_LT:
			// x < y <-> r <=> y >= (x+1) <- r /\ x >= y <- !r
			newBinGE(IntView<>(y), IntView<>(x, 1, 1 - c), r);
			newBinGE(IntView<>(x), IntView<>(y, 1, c), ~r);
			break;
		case IRT_GE:
			int_rel_reif(x, IRT_LT, y, ~r, c);
			break;
		case IRT_GT:
			int_rel_reif(x, IRT_LE, y, ~r, c);
			break;
		default:
			NEVER;
	}
}